

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest01SignatureVerification_::
Section1ValidSignaturesTest1<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::
~Section1ValidSignaturesTest1
          (Section1ValidSignaturesTest1<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  Section1ValidSignaturesTest1<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  ~Section1ValidSignaturesTest1(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest01SignatureVerification,
                     Section1ValidSignaturesTest1) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "GoodCACert",
                               "ValidCertificatePathTest1EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "GoodCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.1.1";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}